

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.c
# Opt level: O1

objucxdef *
objuini(mcmcxdef *ctx,ushort siz,_func_void_void_ptr_uchar_ptr *undocb,
       _func_ushort_void_ptr_uchar_ptr *sizecb,void *callctx)

{
  objucxdef *poVar1;
  uint uVar2;
  uint uVar3;
  undefined6 in_register_00000032;
  
  uVar3 = (uint)CONCAT62(in_register_00000032,siz);
  uVar2 = 0xfec1;
  if (uVar3 < 0xfec1) {
    uVar2 = uVar3;
  }
  poVar1 = (objucxdef *)mchalo(ctx->mcmcxgl->mcmcxerr,(ulong)(uVar2 + 0x3f & 0xffff),"objuini");
  poVar1->objucxmem = ctx;
  poVar1->objucxerr = ctx->mcmcxgl->mcmcxerr;
  poVar1->objucxsiz = (ushort)uVar2;
  poVar1->objucxhead = 0;
  poVar1->objucxtail = 0;
  poVar1->objucxprv = 0;
  poVar1->objucxtop = 0;
  poVar1->objucxcun = undocb;
  poVar1->objucxcsz = sizecb;
  poVar1->objucxccx = callctx;
  return poVar1;
}

Assistant:

objucxdef *objuini(mcmcxdef *ctx, ushort siz,
                   void (*undocb)(void *, uchar *), 
                   ushort (*sizecb)(void *, uchar *),
                   void *callctx)
{
    objucxdef *ret;
    long       totsiz;

    /* force size into valid range */
    totsiz = (long)siz + sizeof(objucxdef) - 1;
    if (totsiz > 0xff00)
        siz = 0xff00 - sizeof(objucxdef) + 1;

    ret = (objucxdef *)mchalo(ctx->mcmcxgl->mcmcxerr,
                              (sizeof(objucxdef) + siz - 1),
                              "objuini");
    
    ret->objucxmem  = ctx;
    ret->objucxerr  = ctx->mcmcxgl->mcmcxerr;
    ret->objucxsiz  = siz;
    ret->objucxhead = ret->objucxprv = ret->objucxtail = ret->objucxtop = 0;
    
    /* set client callback functions */
    ret->objucxcun = undocb;               /* callback to apply client undo */
    ret->objucxcsz = sizecb;         /* callback to get size of client undo */
    ret->objucxccx = callctx;      /* context for client callback functions */
    
    return(ret);
}